

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

int8_t mpack_node_exttype(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_ext) {
      node_local.tree._7_1_ = mpack_node_exttype_unchecked(node);
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree._7_1_ = '\0';
    }
  }
  else {
    node_local.tree._7_1_ = '\0';
  }
  return node_local.tree._7_1_;
}

Assistant:

MPACK_INLINE int8_t mpack_node_exttype(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_ext)
        return mpack_node_exttype_unchecked(node);

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}